

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O1

string * __thiscall
duckdb::StringStatisticsState::GetMinValue_abi_cxx11_
          (string *__return_storage_ptr__,StringStatisticsState *this)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = (*(this->super_ColumnWriterStatistics)._vptr_ColumnWriterStatistics[2])(this);
  if ((char)iVar2 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->min)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->min)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? min : string();
	}